

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O1

SBuf * lj_buf_puttab(SBuf *sb,GCtab *t,GCstr *sep,int32_t i,int32_t e)

{
  uint uVar1;
  MSize sz;
  char cVar2;
  size_t __n;
  SBuf *sb_00;
  ulong uVar3;
  cTValue *pcVar4;
  char *pcVar5;
  
  if (sep == (GCstr *)0x0) {
    __n = 0;
  }
  else {
    __n = (size_t)sep->len;
  }
  if (i <= e) {
    do {
      if ((uint)i < t->asize) {
        pcVar4 = (cTValue *)((long)i * 8 + (t->array).ptr64);
      }
      else {
        pcVar4 = lj_tab_getinth(t,i);
      }
      if (pcVar4 == (cTValue *)0x0) {
LAB_00110d7b:
        pcVar5 = (char *)(long)i;
        cVar2 = '\x01';
      }
      else {
        uVar3 = pcVar4->it64 >> 0x2f;
        sz = (MSize)__n;
        if (uVar3 == 0xfffffffffffffffb) {
          uVar1 = *(uint *)((pcVar4->it64 & 0x7fffffffffffU) + 0x14);
          pcVar5 = sb->w;
          if ((uint)(*(int *)&sb->e - (int)pcVar5) < uVar1 + sz) {
            pcVar5 = lj_buf_more2(sb,uVar1 + sz);
          }
          memcpy(pcVar5,(void *)((pcVar4->u64 & 0x7fffffffffff) + 0x18),(ulong)uVar1);
          pcVar5 = pcVar5 + uVar1;
        }
        else {
          if (0xfffffffffffffff1 < uVar3) goto LAB_00110d7b;
          sb_00 = lj_strfmt_putfnum(sb,0xf000035,pcVar4->n);
          pcVar5 = sb_00->w;
          if ((uint)(*(int *)&sb_00->e - (int)pcVar5) < sz) {
            pcVar5 = lj_buf_more2(sb_00,sz);
          }
        }
        if (sz == 0 || i == e) {
          cVar2 = (i == e) * '\x02';
          i = i + 1U;
        }
        else {
          memcpy(pcVar5,sep + 1,__n);
          pcVar5 = pcVar5 + __n;
          cVar2 = '\0';
          i = i + 1U;
        }
      }
      sb->w = pcVar5;
    } while (cVar2 == '\0');
    if (cVar2 != '\x02') {
      sb = (SBuf *)0x0;
    }
  }
  return sb;
}

Assistant:

SBuf *lj_buf_puttab(SBuf *sb, GCtab *t, GCstr *sep, int32_t i, int32_t e)
{
  MSize seplen = sep ? sep->len : 0;
  if (i <= e) {
    for (;;) {
      cTValue *o = lj_tab_getint(t, i);
      char *w;
      if (!o) {
      badtype:  /* Error: bad element type. */
	sb->w = (char *)(intptr_t)i;  /* Store failing index. */
	return NULL;
      } else if (tvisstr(o)) {
	MSize len = strV(o)->len;
	w = lj_buf_wmem(lj_buf_more(sb, len + seplen), strVdata(o), len);
      } else if (tvisint(o)) {
	w = lj_strfmt_wint(lj_buf_more(sb, STRFMT_MAXBUF_INT+seplen), intV(o));
      } else if (tvisnum(o)) {
	w = lj_buf_more(lj_strfmt_putfnum(sb, STRFMT_G14, numV(o)), seplen);
      } else {
	goto badtype;
      }
      if (i++ == e) {
	sb->w = w;
	break;
      }
      if (seplen) w = lj_buf_wmem(w, strdata(sep), seplen);
      sb->w = w;
    }
  }
  return sb;
}